

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

bigint * __thiscall fmt::v6::internal::bigint::operator<<=(bigint *this,int shift)

{
  uint uVar1;
  uint *puVar2;
  byte bVar3;
  sbyte sVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  
  if (-1 < shift) {
    this->exp_ = this->exp_ + ((uint)shift >> 5);
    if (((shift & 0x1fU) != 0) &&
       (sVar5 = (this->bigits_).super_buffer<unsigned_int>.size_, sVar5 != 0)) {
      puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      sVar4 = (sbyte)(shift & 0x1fU);
      sVar9 = 0;
      uVar6 = 0;
      do {
        uVar1 = puVar2[sVar9];
        bVar3 = 0x20U - sVar4 & 0x1f;
        uVar7 = uVar1 >> bVar3;
        puVar2[sVar9] = (uVar1 << sVar4) + uVar6;
        sVar9 = sVar9 + 1;
        uVar6 = uVar7;
      } while (sVar5 != sVar9);
      if (uVar1 >> bVar3 != 0) {
        uVar8 = sVar5 + 1;
        if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar8) {
          (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
          sVar5 = (this->bigits_).super_buffer<unsigned_int>.size_;
          uVar8 = sVar5 + 1;
        }
        puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
        (this->bigits_).super_buffer<unsigned_int>.size_ = uVar8;
        puVar2[sVar5] = uVar7;
      }
    }
    return this;
  }
  __assert_fail("shift >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/spdlog/fmt/bundled/format-inl.h"
                ,0x256,"bigint &fmt::internal::bigint::operator<<=(int)");
}

Assistant:

bigint& operator<<=(int shift) {
    assert(shift >= 0);
    exp_ += shift / bigit_bits;
    shift %= bigit_bits;
    if (shift == 0) return *this;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      bigit c = bigits_[i] >> (bigit_bits - shift);
      bigits_[i] = (bigits_[i] << shift) + carry;
      carry = c;
    }
    if (carry != 0) bigits_.push_back(carry);
    return *this;
  }